

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String Bstrlib::operator+(uint8 *a,String *b)

{
  uchar *extraout_RDX;
  String SVar2;
  String SStack_28;
  uchar *puVar1;
  
  String::String(&SStack_28,(char *)b);
  SVar2 = String::operator+((String *)a,&SStack_28);
  puVar1 = SVar2.super_tagbstring.data;
  if (SStack_28.super_tagbstring.data != (uchar *)0x0) {
    free(SStack_28.super_tagbstring.data);
    puVar1 = extraout_RDX;
  }
  SVar2.super_tagbstring.data = puVar1;
  SVar2.super_tagbstring._0_8_ = a;
  return (String)SVar2.super_tagbstring;
}

Assistant:

const String operator+(const uint8 * a, const String& b)
    {
        return String((const char *)a) + b;
    }